

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::checkFormatSupport
               (ContextInfo *info,deUint32 format,deUint32 target,RenderContext *ctx)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  CompressedTexFormat format_00;
  int iVar3;
  NotSupportedError *this;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->_vptr_RenderContext[2])(ctx);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  bVar2 = glu::isCompressedFormat(format);
  if (bVar2) {
    format_00 = glu::mapGLCompressedTexFormat(format);
    bVar2 = tcu::isAstcFormat(format_00);
    if (bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported(info,"GL_KHR_texture_compression_astc_hdr");
      if (!bVar2) {
        bVar2 = glu::ContextInfo::isExtensionSupported(info,"GL_OES_texture_compression_astc");
        if (!bVar2) {
          if (target == 0x806f) {
            this = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (this,"TEXTURE_3D target requires HDR astc support.",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                       ,0x771);
LAB_01657edd:
            __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          if (!bVar1) {
            bVar1 = glu::ContextInfo::isExtensionSupported
                              (info,"GL_KHR_texture_compression_astc_ldr");
            if (!bVar1) {
              this = (NotSupportedError *)__cxa_allocate_exception(0x38);
              tcu::NotSupportedError::NotSupportedError
                        (this,"Compressed astc texture not supported.",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                         ,0x773);
              goto LAB_01657edd;
            }
          }
        }
      }
    }
    else {
      iVar3 = (*info->_vptr_ContextInfo[10])(info,(ulong)format);
      if ((char)iVar3 == '\0') {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this,"Compressed texture not supported.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                   ,0x779);
        goto LAB_01657edd;
      }
    }
  }
  return;
}

Assistant:

void checkFormatSupport (glu::ContextInfo& info, deUint32 format, deUint32 target, glu::RenderContext& ctx)
{
	const bool isES32 = glu::contextSupports(ctx.getType(), glu::ApiType::es(3, 2));

	if (glu::isCompressedFormat(format))
	{
		if (isAstcFormat(glu::mapGLCompressedTexFormat(format)))
		{
			DE_ASSERT(target != GL_RENDERBUFFER);
			if (!info.isExtensionSupported("GL_KHR_texture_compression_astc_hdr") &&
				!info.isExtensionSupported("GL_OES_texture_compression_astc"))
			{
				if (target == GL_TEXTURE_3D)
					TCU_THROW(NotSupportedError, "TEXTURE_3D target requires HDR astc support.");
				if (!isES32 && !info.isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
					TCU_THROW(NotSupportedError, "Compressed astc texture not supported.");
			}
		}
		else
		{
			if (!info.isCompressedTextureFormatSupported(format))
				TCU_THROW(NotSupportedError, "Compressed texture not supported.");
		}
	}
}